

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int warn_is_numeric_type(lys_type *type)

{
  int iVar1;
  bool bVar2;
  int local_2c;
  int ret;
  int found;
  lys_type *t;
  lys_node *node;
  lys_type *type_local;
  
  _ret = (lys_type *)0x0;
  local_2c = 0;
  node = (lys_node *)type;
  switch(type->base) {
  case LY_TYPE_DEC64:
  case LY_TYPE_INT8:
  case LY_TYPE_UINT8:
  case LY_TYPE_INT16:
  case LY_TYPE_UINT16:
  case LY_TYPE_INT32:
  case LY_TYPE_UINT32:
  case LY_TYPE_INT64:
  case LY_TYPE_UINT64:
    type_local._4_4_ = 1;
    break;
  default:
    type_local._4_4_ = 0;
    break;
  case LY_TYPE_LEAFREF:
    if ((type->info).lref.target == (lys_node_leaf *)0x0) {
      if (type->parent + 1 != (lys_tpdf *)type) {
        __assert_fail("&((struct lys_node_leaf *)type->parent)->type == type",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                      ,0xb2f,"int warn_is_numeric_type(struct lys_type *)");
      }
      t = (lys_type *)type->parent;
      while( true ) {
        bVar2 = false;
        if (t != (lys_type *)0x0) {
          bVar2 = *(int *)((long)&t->info + 0x18) != 0x800;
        }
        if (!bVar2) break;
        t = *(lys_type **)(t + 1);
      }
      if (t == (lys_type *)0x0) {
        ly_log(type->parent->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
               ,0xb32);
      }
      type_local._4_4_ = 0;
    }
    else {
      type_local._4_4_ = warn_is_numeric_type(&((type->info).lref.target)->type);
    }
    break;
  case LY_TYPE_UNION:
    do {
      _ret = lyp_get_next_union_type((lys_type *)node,_ret,&local_2c);
      if (_ret == (lys_type *)0x0) {
        return 0;
      }
      local_2c = 0;
      iVar1 = warn_is_numeric_type(_ret);
    } while (iVar1 == 0);
    type_local._4_4_ = 1;
  }
  return type_local._4_4_;
}

Assistant:

static int
warn_is_numeric_type(struct lys_type *type)
{
    struct lys_node *node;
    struct lys_type *t = NULL;
    int found = 0, ret;

    switch (type->base) {
    case LY_TYPE_DEC64:
    case LY_TYPE_INT8:
    case LY_TYPE_UINT8:
    case LY_TYPE_INT16:
    case LY_TYPE_UINT16:
    case LY_TYPE_INT32:
    case LY_TYPE_UINT32:
    case LY_TYPE_INT64:
    case LY_TYPE_UINT64:
        return 1;
    case LY_TYPE_UNION:
        while ((t = lyp_get_next_union_type(type, t, &found))) {
            found = 0;
            ret = warn_is_numeric_type(t);
            if (ret) {
                /* found a suitable type */
                return 1;
            }
        }
        /* did not find any suitable type */
        return 0;
    case LY_TYPE_LEAFREF:
        if (!type->info.lref.target) {
            /* we may be in a grouping (and not directly in a typedef) */
            assert(&((struct lys_node_leaf *)type->parent)->type == type);
            for (node = ((struct lys_node *)type->parent); node && (node->nodetype != LYS_GROUPING); node = node->parent);
            if (!node) {
                LOGINT(((struct lys_node *)type->parent)->module->ctx);
            }
            return 0;
        }
        return warn_is_numeric_type(&type->info.lref.target->type);
    default:
        return 0;
    }
}